

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void compile_ref_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks,BOOL withchecks,
               BOOL emptyfail)

{
  ushort uVar1;
  sljit_compiler *compiler;
  sljit_jump *psVar2;
  sljit_jump *psVar3;
  sljit_label *psVar4;
  sljit_jump *psVar5;
  jump_list **ppjVar6;
  sljit_s32 src1;
  sljit_sw src1w;
  sljit_jump *local_50;
  
  compiler = common->compiler;
  if ((ushort)(*cc - 0x71) < 2) {
    uVar1 = cc[1];
    sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start + (ulong)uVar1 * 0x10);
    if ((withchecks != 0) && (common->unset_backref == 0)) {
      psVar2 = sljit_emit_cmp(compiler,0,1,0,0x8e,(long)common->ovector_start + 8);
      add_jump(compiler,backtracks,psVar2);
    }
    src1w = (long)common->ovector_start + (ulong)uVar1 * 0x10 + 8;
    src1 = 0x8e;
  }
  else {
    sljit_emit_op1(compiler,0x20,1,0,0x84,0);
    src1w = 8;
    src1 = 0x84;
  }
  sljit_emit_op2(compiler,0x262,4,0,src1,src1w,1,0);
  if (withchecks == 0) {
    local_50 = (sljit_jump *)0x0;
  }
  else {
    local_50 = sljit_emit_jump(compiler,0);
  }
  sljit_emit_op2(compiler,0x60,2,0,2,0,4,0);
  psVar2 = sljit_emit_cmp(compiler,4,2,0,0xd,0);
  if (common->mode == 1) {
    add_jump(compiler,backtracks,psVar2);
  }
  ppjVar6 = &common->caselesscmp;
  if (*cc == 0x71) {
    ppjVar6 = &common->casefulcmp;
  }
  psVar3 = sljit_emit_jump(compiler,0x19);
  add_jump(compiler,ppjVar6,psVar3);
  psVar3 = sljit_emit_cmp(compiler,1,4,0,0x40,0);
  add_jump(compiler,backtracks,psVar3);
  if (common->mode != 1) {
    psVar3 = sljit_emit_jump(compiler,0x18);
    psVar4 = sljit_emit_label(compiler);
    sljit_set_label(psVar2,psVar4);
    sljit_emit_op2(compiler,0x62,4,0,4,0,2,0);
    sljit_emit_op2(compiler,0x60,4,0,4,0,0xd,0);
    psVar2 = sljit_emit_cmp(compiler,0,4,0,0x40,0);
    sljit_emit_op1(compiler,0x20,2,0,0xd,0);
    ppjVar6 = &common->caselesscmp;
    if (*cc == 0x71) {
      ppjVar6 = &common->casefulcmp;
    }
    psVar5 = sljit_emit_jump(compiler,0x19);
    add_jump(compiler,ppjVar6,psVar5);
    psVar5 = sljit_emit_cmp(compiler,1,4,0,0x40,0);
    add_jump(compiler,backtracks,psVar5);
    psVar4 = sljit_emit_label(compiler);
    sljit_set_label(psVar2,psVar4);
    check_partial(common,0);
    psVar2 = sljit_emit_jump(compiler,0x18);
    add_jump(compiler,backtracks,psVar2);
    psVar4 = sljit_emit_label(compiler);
    sljit_set_label(psVar3,psVar4);
  }
  if (local_50 != (sljit_jump *)0x0) {
    if (emptyfail != 0) {
      add_jump(compiler,backtracks,local_50);
      return;
    }
    psVar4 = sljit_emit_label(compiler);
    if (psVar4 != (sljit_label *)0x0) {
      local_50->flags = (local_50->flags & 0xfffffffffffffffcU) + 1;
      (local_50->u).label = psVar4;
    }
  }
  return;
}

Assistant:

static void compile_ref_matchingpath(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks, BOOL withchecks, BOOL emptyfail)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
int offset = 0;
struct sljit_jump *jump = NULL;
struct sljit_jump *partial;
struct sljit_jump *nopartial;

if (ref)
  {
  offset = GET2(cc, 1) << 1;
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
  /* OVECTOR(1) contains the "string begin - 1" constant. */
  if (withchecks && !common->unset_backref)
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
  }
else
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);

#if defined SUPPORT_UNICODE
if (common->utf && *cc == OP_REFI)
  {
  SLJIT_ASSERT(TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  if (ref)
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));

  if (withchecks)
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_R2, 0);
  /* No free saved registers so save data on stack. */

  OP1(SLJIT_MOV, SLJIT_R3, 0, STR_END, 0);
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW) | SLJIT_ARG3(SW) | SLJIT_ARG4(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_utf_caselesscmp));
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_RETURN_REG, 0);

  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, CMP(SLJIT_LESS_EQUAL, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1));
  else
    {
    OP2(SLJIT_SUB | SLJIT_SET_Z | SLJIT_SET_LESS, SLJIT_UNUSED, 0, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1);

    add_jump(compiler, backtracks, JUMP(SLJIT_LESS));

    nopartial = JUMP(SLJIT_NOT_EQUAL);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }
else
#endif /* SUPPORT_UNICODE */
  {
  if (ref)
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), TMP1, 0);
  else
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw), TMP1, 0);

  if (withchecks)
    jump = JUMP(SLJIT_ZERO);

  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP2, 0);
  partial = CMP(SLJIT_GREATER, STR_PTR, 0, STR_END, 0);
  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, partial);

  add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
  add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));

  if (common->mode != PCRE2_JIT_COMPLETE)
    {
    nopartial = JUMP(SLJIT_JUMP);
    JUMPHERE(partial);
    /* TMP2 -= STR_END - STR_PTR */
    OP2(SLJIT_SUB, TMP2, 0, TMP2, 0, STR_PTR, 0);
    OP2(SLJIT_ADD, TMP2, 0, TMP2, 0, STR_END, 0);
    partial = CMP(SLJIT_EQUAL, TMP2, 0, SLJIT_IMM, 0);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));
    JUMPHERE(partial);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }

if (jump != NULL)
  {
  if (emptyfail)
    add_jump(compiler, backtracks, jump);
  else
    JUMPHERE(jump);
  }
}